

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_next(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  int in_ESI;
  lua_State *in_RDI;
  int more;
  cTValue *t;
  undefined4 in_stack_fffffffffffffff0;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  iVar1 = lj_tab_next(in_RDI,(GCtab *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),pTVar2);
  if (iVar1 == 0) {
    in_RDI->top = in_RDI->top + -1;
  }
  else {
    pTVar2 = in_RDI->top;
    in_RDI->top = pTVar2 + 1;
    if ((TValue *)(ulong)(in_RDI->maxstack).ptr32 <= pTVar2 + 1) {
      lj_state_growstack1((lua_State *)0x1129db);
    }
  }
  return iVar1;
}

Assistant:

LUA_API int lua_next(lua_State *L, int idx)
{
  cTValue *t = index2adr(L, idx);
  int more;
  lj_checkapi(tvistab(t), "stack slot %d is not a table", idx);
  more = lj_tab_next(L, tabV(t), L->top-1);
  if (more) {
    incr_top(L);  /* Return new key and value slot. */
  } else {  /* End of traversal. */
    L->top--;  /* Remove key slot. */
  }
  return more;
}